

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::QueueCommand<swrenderer::RtInitColsPalCommand,unsigned_char*&>
               (uchar **args)

{
  RtInitColsPalCommand *pRVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  RtInitColsPalCommand *local_60;
  RtInitColsPalCommand *local_58;
  RtInitColsPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_32;
  _lambda_void___1_ local_31;
  undefined1 local_30 [8];
  RtInitColsPalCommand command;
  DrawerCommandQueue *queue;
  uchar **args_local;
  
  command.buff = (uint8_t *)Instance();
  if ((((DrawerCommandQueue *)command.buff)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::RtInitColsPalCommand::RtInitColsPalCommand((RtInitColsPalCommand *)local_30,*args);
    tryBlock = QueueCommand(unsigned_char*&)::{lambda(void*)#1}::operator_cast_to_function_pointer
                         (&local_31);
    catchBlock = QueueCommand(unsigned_char*&)::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_32);
    VectoredTryCatch((RtInitColsPalCommand *)local_30,tryBlock,catchBlock);
    swrenderer::RtInitColsPalCommand::~RtInitColsPalCommand((RtInitColsPalCommand *)local_30);
  }
  else {
    command_1 = (RtInitColsPalCommand *)AllocMemory(0x18);
    if (command_1 == (RtInitColsPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command.buff);
      command_1 = (RtInitColsPalCommand *)AllocMemory(0x18);
      if (command_1 == (RtInitColsPalCommand *)0x0) {
        return;
      }
    }
    pRVar1 = command_1;
    swrenderer::RtInitColsPalCommand::RtInitColsPalCommand(command_1,*args);
    local_58 = pRVar1;
    local_60 = pRVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (command.buff + 0x1000008),(value_type *)&local_60);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}